

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O3

O3DGCErrorCode o3dgc::LoadBinAC(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  unsigned_long uVar1;
  uchar *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long size;
  Arithmetic_Codec acd;
  Adaptive_Bit_Model bModel;
  ulong local_78;
  Arithmetic_Codec local_70;
  Adaptive_Bit_Model local_3c;
  
  uVar4 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  size = BinaryStream::ReadUInt32Bin(bstream,iterator);
  if (size != 0) {
    uVar1 = *iterator;
    puVar2 = (bstream->m_stream).m_buffer;
    *iterator = (uVar1 + uVar4) - 8;
    Vector<long>::Allocate(data,size);
    Arithmetic_Codec::Arithmetic_Codec(&local_70);
    Arithmetic_Codec::set_buffer(&local_70,(int)uVar4 - 8,puVar2 + uVar1);
    Arithmetic_Codec::start_decoder(&local_70);
    Adaptive_Bit_Model::Adaptive_Bit_Model(&local_3c);
    do {
      uVar3 = Arithmetic_Codec::decode(&local_70,&local_3c);
      local_78 = (ulong)uVar3;
      Vector<long>::PushBack(data,(long *)&local_78);
      size = size - 1;
    } while (size != 0);
    Arithmetic_Codec::~Arithmetic_Codec(&local_70);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadBinAC(Vector<long> & data,
                                const BinaryStream & bstream,
                                unsigned long & iterator) 
    {
        unsigned long sizeSize = bstream.ReadUInt32Bin(iterator) - 8;
        unsigned long size     = bstream.ReadUInt32Bin(iterator);
        if (size == 0)
        {
            return O3DGC_OK;
        }
        unsigned char * buffer = 0;
        bstream.GetBuffer(iterator, buffer);
        iterator += sizeSize;
        data.Allocate(size);
        Arithmetic_Codec acd;
        acd.set_buffer(sizeSize, buffer);
        acd.start_decoder();
        Adaptive_Bit_Model bModel;
#ifdef DEBUG_VERBOSE
        printf("-----------\nsize %i\n", size);
        fprintf(g_fileDebugTF, "size %i\n", size);
#endif //DEBUG_VERBOSE
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(acd.decode(bModel));
#ifdef DEBUG_VERBOSE
            printf("%i\t%i\n", i, data[i]);
            fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
        }
        return O3DGC_OK;
    }